

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(seqStore_t *seqStore,ZSTD_CCtx *zc)

{
  ZSTD_compressedBlockState_t *CTable;
  uint *count;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  ulong nbSeq;
  ulong sourceSize;
  BYTE *codeTable;
  uint *countWksp;
  U32 defaultMax;
  void *in_stack_fffffffffffffe70;
  undefined4 uStack_188;
  uint maxSymbolValue;
  BYTE *local_180;
  BYTE *local_178;
  BYTE *local_170;
  ZSTD_entropyCTablesMetadata_t entropyMetadata;
  
  sVar1 = ZSTD_buildBlockEntropyStats
                    (seqStore,&((zc->blockState).prevCBlock)->entropy,
                     &((zc->blockState).nextCBlock)->entropy,&zc->appliedParams,&entropyMetadata,
                     zc->entropyWorkspace,0x19d8);
  if (sVar1 < 0xffffffffffffff89) {
    sourceSize = (long)seqStore->lit - (long)seqStore->litStart;
    codeTable = seqStore->ofCode;
    local_178 = seqStore->llCode;
    local_170 = seqStore->mlCode;
    nbSeq = (long)seqStore->sequences - (long)seqStore->sequencesStart >> 3;
    CTable = (zc->blockState).nextCBlock;
    count = zc->entropyWorkspace;
    maxSymbolValue = 0xff;
    if (entropyMetadata.hufMetadata.hType - set_compressed < 2) {
      in_stack_fffffffffffffe70 = (void *)0x1bb793;
      local_180 = codeTable;
      sVar1 = HIST_count_wksp(count,&maxSymbolValue,seqStore->litStart,sourceSize,count,0x19d8);
      codeTable = local_180;
      if (sVar1 < 0xffffffffffffff89) {
        in_stack_fffffffffffffe70 = (void *)0x1bb7ac;
        sVar1 = HUF_estimateCompressedSize((HUF_CElt *)CTable,count,maxSymbolValue);
        if (entropyMetadata.hufMetadata.hType != set_compressed) {
          entropyMetadata.hufMetadata.hufDesSize = 0;
        }
        sVar2 = entropyMetadata.hufMetadata.hufDesSize + 6;
        if (sourceSize < 0x100) {
          sVar2 = entropyMetadata.hufMetadata.hufDesSize;
        }
        sourceSize = ((ulong)(0x3ff < sourceSize) - (ulong)(sourceSize < 0x4000)) + 4 +
                     sVar2 + sVar1;
        codeTable = local_180;
      }
    }
    else if (entropyMetadata.hufMetadata.hType != set_basic) {
      if (entropyMetadata.hufMetadata.hType == set_rle) {
        sourceSize = 1;
      }
      else {
        sourceSize = 0;
      }
    }
    defaultMax = (U32)count;
    sVar1 = ZSTD_estimateBlockSize_symbolType
                      (entropyMetadata.fseMetadata.ofType,codeTable,nbSeq,0x1f,
                       (CTable->entropy).fse.offcodeCTable,(U32 *)0x0,OF_defaultNorm,5,defaultMax,
                       in_stack_fffffffffffffe70,CONCAT44(maxSymbolValue,uStack_188));
    sVar2 = ZSTD_estimateBlockSize_symbolType
                      (entropyMetadata.fseMetadata.llType,local_178,nbSeq,0x23,
                       (CTable->entropy).fse.litlengthCTable,LL_bits,LL_defaultNorm,6,defaultMax,
                       in_stack_fffffffffffffe70,CONCAT44(maxSymbolValue,uStack_188));
    sVar3 = ZSTD_estimateBlockSize_symbolType
                      (entropyMetadata.fseMetadata.mlType,local_170,nbSeq,0x34,
                       (CTable->entropy).fse.matchlengthCTable,ML_bits,ML_defaultNorm,6,defaultMax,
                       in_stack_fffffffffffffe70,CONCAT44(maxSymbolValue,uStack_188));
    sVar1 = entropyMetadata.fseMetadata.fseTablesSize +
            sVar1 + sourceSize + sVar2 + sVar3 + ((ulong)(0x7f < nbSeq) - (ulong)(nbSeq < 0x7f00)) +
            6;
  }
  return sVar1;
}

Assistant:

static size_t ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(seqStore_t* seqStore, const ZSTD_CCtx* zc) {
    ZSTD_entropyCTablesMetadata_t entropyMetadata;
    FORWARD_IF_ERROR(ZSTD_buildBlockEntropyStats(seqStore,
                    &zc->blockState.prevCBlock->entropy,
                    &zc->blockState.nextCBlock->entropy,
                    &zc->appliedParams,
                    &entropyMetadata,
                    zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */), "");
    return ZSTD_estimateBlockSize(seqStore->litStart, (size_t)(seqStore->lit - seqStore->litStart),
                    seqStore->ofCode, seqStore->llCode, seqStore->mlCode,
                    (size_t)(seqStore->sequences - seqStore->sequencesStart),
                    &zc->blockState.nextCBlock->entropy, &entropyMetadata, zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE,
                    (int)(entropyMetadata.hufMetadata.hType == set_compressed), 1);
}